

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
                 *this,GetterXsYs<unsigned_int> *getter1,GetterXsYs<unsigned_int> *getter2,
                TransformerLinLin *transformer,ImU32 col)

{
  int iVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImPlotContext *pIVar4;
  int iVar5;
  long lVar6;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar1 = getter1->Count;
  iVar5 = getter2->Count;
  if (iVar1 < getter2->Count) {
    iVar5 = iVar1;
  }
  this->Prims = iVar5 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar4 = GImPlot;
  (this->P12).y = 0.0;
  lVar6 = (long)((getter1->Offset % iVar1 + iVar1) % iVar1) * (long)getter1->Stride;
  iVar1 = transformer->YAxis;
  IVar2.y = (float)(((double)*(uint *)((long)getter1->Ys + lVar6) -
                    GImPlot->CurrentPlot->YAxis[iVar1].Range.Min) * GImPlot->My[iVar1] +
                   (double)GImPlot->PixelRange[iVar1].Min.y);
  IVar2.x = (float)(((double)*(uint *)((long)getter1->Xs + lVar6) -
                    (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                   (double)GImPlot->PixelRange[iVar1].Min.x);
  this->P11 = IVar2;
  iVar1 = getter2->Count;
  lVar6 = (long)((getter2->Offset % iVar1 + iVar1) % iVar1) * (long)getter2->Stride;
  iVar1 = transformer->YAxis;
  IVar3.y = (float)(((double)*(uint *)((long)getter2->Ys + lVar6) -
                    pIVar4->CurrentPlot->YAxis[iVar1].Range.Min) * pIVar4->My[iVar1] +
                   (double)pIVar4->PixelRange[iVar1].Min.y);
  IVar3.x = (float)(((double)*(uint *)((long)getter2->Xs + lVar6) -
                    (pIVar4->CurrentPlot->XAxis).Range.Min) * pIVar4->Mx +
                   (double)pIVar4->PixelRange[iVar1].Min.x);
  this->P12 = IVar3;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }